

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::updateEditorGeometries(QAbstractItemView *this)

{
  byte bVar1;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QWidget *t;
  long *plVar5;
  ulong uVar6;
  int i_1;
  int i;
  long in_FS_OFFSET;
  QRect QVar7;
  undefined1 *local_178;
  undefined1 *puStack_170;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_168;
  QArrayDataPointer<QWidget_*> local_158;
  QArrayDataPointer<QWidget_*> local_138;
  piter local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  QVar7._8_8_ = local_108.super_QStyleOption.rect._8_8_;
  QVar7._0_8_ = local_108.super_QStyleOption.rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  pDVar2 = (this_00->editorIndexHash).d;
  if ((pDVar2 != (Data *)0x0) && (local_108.super_QStyleOption.rect = QVar7, pDVar2->size != 0)) {
    if (this_00->delayedPendingLayout == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QAbstractItemViewPrivate::executePostedLayout(this_00);
        return;
      }
      goto LAB_004e69f1;
    }
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)this + 0x2f8))(this,&local_108);
    local_118 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::begin(&this_00->editorIndexHash);
    local_138.d = (Data *)0x0;
    local_138.ptr = (QWidget **)0x0;
    local_138.size = 0;
    local_158.d = (Data *)0x0;
    local_158.ptr = (QWidget **)0x0;
    local_158.size = 0;
    while( true ) {
      if (local_118.d == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 &&
          local_118.bucket == 0) break;
      local_168.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_178 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_170 = &DAT_aaaaaaaaaaaaaaaa;
      pSVar3 = (local_118.d)->spans;
      uVar6 = local_118.bucket >> 7;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_178,
                 (QPersistentModelIndex *)
                 (pSVar3[uVar6].entries[pSVar3[uVar6].offsets[(uint)local_118.bucket & 0x7f]].
                  storage.data + 8));
      pEVar4 = (local_118.d)->spans[local_118.bucket >> 7].entries;
      bVar1 = (local_118.d)->spans[local_118.bucket >> 7].offsets[(uint)local_118.bucket & 0x7f];
      t = *(QWidget **)pEVar4[bVar1].storage.data;
      if (((((int)local_178 < 0) || ((long)local_178 < 0)) ||
          (local_168.ptr == (QAbstractItemModel *)0x0)) || (t == (QWidget *)0x0)) {
        QHash<QPersistentModelIndex,_QEditorInfo>::removeImpl<QPersistentModelIndex>
                  (&this_00->indexEditorHash,
                   (QPersistentModelIndex *)(pEVar4[bVar1].storage.data + 8));
        local_118 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase
                                     (&this_00->editorIndexHash,(const_iterator)local_118);
        QList<QWidget_*>::append((QList<QWidget_*> *)&local_138,t);
      }
      else {
        QVar7 = (QRect)(**(code **)(*(long *)this + 0x1e0))(this,&local_178);
        local_108.super_QStyleOption.rect = QVar7;
        if ((QVar7.x2.m_i.m_i < QVar7.x1.m_i.m_i) || (QVar7.y2.m_i.m_i < QVar7.y1.m_i.m_i)) {
          QList<QWidget_*>::append((QList<QWidget_*> *)&local_158,t);
        }
        else {
          QWidget::show(t);
          plVar5 = (long *)(**(code **)(*(long *)this + 0x208))(this,&local_178);
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 0x90))(plVar5,t,&local_108,&local_178);
          }
        }
        QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::operator++
                  (&local_118);
      }
    }
    for (uVar6 = 0; uVar6 < (ulong)local_158.size; uVar6 = uVar6 + 1) {
      QWidget::hide(local_158.ptr[uVar6]);
    }
    for (uVar6 = 0; uVar6 < (ulong)local_138.size; uVar6 = uVar6 + 1) {
      local_178 = (undefined1 *)0xffffffffffffffff;
      puStack_170 = (undefined1 *)0x0;
      local_168.ptr = (QAbstractItemModel *)0x0;
      QAbstractItemViewPrivate::releaseEditor
                (this_00,local_138.ptr[uVar6],(QModelIndex *)&local_178);
    }
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_138);
    QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004e69f1:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::updateEditorGeometries()
{
    Q_D(QAbstractItemView);
    if (d->editorIndexHash.isEmpty())
        return;
    if (d->delayedPendingLayout) {
        // doItemsLayout() will end up calling this function again
        d->executePostedLayout();
        return;
    }
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    QEditorIndexHash::iterator it = d->editorIndexHash.begin();
    QWidgetList editorsToRelease;
    QWidgetList editorsToHide;
    while (it != d->editorIndexHash.end()) {
        QModelIndex index = it.value();
        QWidget *editor = it.key();
        if (index.isValid() && editor) {
            option.rect = visualRect(index);
            if (option.rect.isValid()) {
                editor->show();
                QAbstractItemDelegate *delegate = itemDelegateForIndex(index);
                if (delegate)
                    delegate->updateEditorGeometry(editor, option, index);
            } else {
                editorsToHide << editor;
            }
            ++it;
        } else {
            d->indexEditorHash.remove(it.value());
            it = d->editorIndexHash.erase(it);
            editorsToRelease << editor;
        }
    }

    //we hide and release the editor outside of the loop because it might change the focus and try
    //to change the editors hashes.
    for (int i = 0; i < editorsToHide.size(); ++i) {
        editorsToHide.at(i)->hide();
    }
    for (int i = 0; i < editorsToRelease.size(); ++i) {
        d->releaseEditor(editorsToRelease.at(i));
    }
}